

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.cpp
# Opt level: O0

Address CreateAddress(string *ip,int port)

{
  Address AVar1;
  uint16_t uVar2;
  char *__cp;
  uint16_t local_24;
  int port_local;
  string *ip_local;
  sockaddr_in address;
  
  ip_local._0_2_ = 2;
  __cp = (char *)std::__cxx11::string::c_str();
  inet_pton(2,__cp,(void *)((long)&ip_local + 4));
  local_24 = (uint16_t)port;
  uVar2 = htons(local_24);
  AVar1.sin_port = uVar2;
  AVar1.sin_family = ip_local._0_2_;
  AVar1.sin_addr.s_addr = ip_local._4_4_;
  AVar1.sin_zero[0] = (undefined1)address.sin_family;
  AVar1.sin_zero[1] = address.sin_family._1_1_;
  AVar1.sin_zero[2] = (undefined1)address.sin_port;
  AVar1.sin_zero[3] = address.sin_port._1_1_;
  AVar1.sin_zero[4] = (undefined1)address.sin_addr.s_addr;
  AVar1.sin_zero[5] = address.sin_addr.s_addr._1_1_;
  AVar1.sin_zero[6] = address.sin_addr.s_addr._2_1_;
  AVar1.sin_zero[7] = address.sin_addr.s_addr._3_1_;
  return AVar1;
}

Assistant:

Address CreateAddress(std::string ip, int port){
    struct sockaddr_in address;

    address.sin_family = AF_INET;
    //address.sin_addr.s_addr = inet_addr(ip.c_str());
    inet_pton(AF_INET, ip.c_str(), &address.sin_addr);
    address.sin_port = htons(port);

    return address;
}